

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O2

int PKCS12_handle_sequence
              (CBS *sequence,pkcs12_context *ctx,
              _func_int_CBS_ptr_pkcs12_context_ptr *handle_element)

{
  int iVar1;
  int iVar2;
  uint8_t *storage;
  CBS child;
  CBS in;
  CBS element;
  
  storage = (uint8_t *)0x0;
  iVar1 = CBS_asn1_ber_to_der(sequence,&in,&storage);
  if (iVar1 == 0) {
    iVar1 = 0;
    ERR_put_error(0x13,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                  ,0xd4);
  }
  else {
    iVar1 = CBS_get_asn1(&in,&child,0x20000010);
    if ((iVar1 == 0) || (in.len != 0)) {
      iVar1 = 0;
      ERR_put_error(0x13,0,100,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                    ,0xda);
    }
    else {
      iVar1 = 1;
      do {
        if (child.len == 0) goto LAB_00190180;
        iVar2 = CBS_get_asn1(&child,&element,0x20000010);
        if (iVar2 == 0) {
          ERR_put_error(0x13,0,100,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                        ,0xe1);
          break;
        }
        iVar2 = (*handle_element)(&element,ctx);
      } while (iVar2 != 0);
      iVar1 = 0;
    }
LAB_00190180:
    OPENSSL_free(storage);
  }
  return iVar1;
}

Assistant:

static int PKCS12_handle_sequence(
    CBS *sequence, struct pkcs12_context *ctx,
    int (*handle_element)(CBS *cbs, struct pkcs12_context *ctx)) {
  uint8_t *storage = NULL;
  CBS in;
  int ret = 0;

  // Although a BER->DER conversion is done at the beginning of |PKCS12_parse|,
  // the ASN.1 data gets wrapped in OCTETSTRINGs and/or encrypted and the
  // conversion cannot see through those wrappings. So each time we step
  // through one we need to convert to DER again.
  if (!CBS_asn1_ber_to_der(sequence, &in, &storage)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
    return 0;
  }

  CBS child;
  if (!CBS_get_asn1(&in, &child, CBS_ASN1_SEQUENCE) || CBS_len(&in) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
    goto err;
  }

  while (CBS_len(&child) > 0) {
    CBS element;
    if (!CBS_get_asn1(&child, &element, CBS_ASN1_SEQUENCE)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      goto err;
    }

    if (!handle_element(&element, ctx)) {
      goto err;
    }
  }

  ret = 1;

err:
  OPENSSL_free(storage);
  return ret;
}